

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O1

void read_32_xrgb_8888_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = al_fread(f,buf,(long)(length * 4));
  memset(buf + lVar1,0,length * 4 - lVar1);
  if (0 < length) {
    uVar2 = 0;
    do {
      *(uint *)(data + uVar2 * 4) =
           (uint)(byte)buf[uVar2 * 4] << 0x10 | (uint)(byte)buf[uVar2 * 4 + 2] |
           (uint)(byte)buf[uVar2 * 4 + 1] << 8 | 0xff000000;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  return;
}

Assistant:

static void read_32_xrgb_8888_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = length * 4;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; i++) {
      uint32_t pixel = read_32le(buf + i*4);
      data32[i] = ALLEGRO_CONVERT_XRGB_8888_TO_ABGR_8888_LE(pixel);
   }
}